

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

bool __thiscall leveldb::MemTable::Get(MemTable *this,LookupKey *key,string *value,Status *s)

{
  bool bVar1;
  int iVar2;
  char **ppcVar3;
  Comparator *pCVar4;
  char *pcVar5;
  char *in_RDX;
  InternalKeyComparator *in_RDI;
  Slice v;
  uint64_t tag;
  char *key_ptr;
  uint32_t key_length;
  char *entry;
  Iterator iter;
  Slice memkey;
  Status *in_stack_ffffffffffffff08;
  Slice *in_stack_ffffffffffffff10;
  Slice *in_stack_ffffffffffffff18;
  Slice local_c8;
  Slice local_b8;
  Slice local_a0;
  uint64_t local_90;
  Slice local_88;
  Slice local_78;
  char *local_68;
  uint local_5c;
  char *local_58;
  char *local_50;
  Iterator local_48;
  Slice local_38;
  char *local_20;
  
  local_20 = in_RDX;
  local_38 = LookupKey::memtable_key((LookupKey *)0x1193a1);
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Iterator
            (&local_48,
             (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)&in_RDI[4].user_comparator_
            );
  local_50 = Slice::data(&local_38);
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Seek
            ((Iterator *)in_stack_ffffffffffffff10,&in_stack_ffffffffffffff08->state_);
  bVar1 = SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Valid(&local_48);
  if (bVar1) {
    ppcVar3 = SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::key(&local_48);
    local_58 = *ppcVar3;
    local_68 = GetVarint32Ptr((char *)in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                              (uint32_t *)in_stack_ffffffffffffff08);
    pCVar4 = InternalKeyComparator::user_comparator(in_RDI);
    Slice::Slice(&local_78,local_68,(ulong)(local_5c - 8));
    local_88 = LookupKey::user_key((LookupKey *)0x119487);
    iVar2 = (*pCVar4->_vptr_Comparator[2])(pCVar4,&local_78,&local_88);
    if (iVar2 == 0) {
      local_90 = DecodeFixed64(local_68 + ((ulong)local_5c - 8));
      if ((char)local_90 == '\0') {
        Slice::Slice(&local_b8);
        Slice::Slice(&local_c8);
        Status::NotFound(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        Status::operator=((Status *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        Status::~Status((Status *)in_stack_ffffffffffffff10);
        return true;
      }
      if ((char)local_90 == '\x01') {
        if (local_20 != (char *)0x0) {
          local_a0 = GetLengthPrefixedSlice((char *)in_stack_ffffffffffffff10);
          pcVar5 = Slice::data(&local_a0);
          Slice::size(&local_a0);
          std::__cxx11::string::assign(local_20,(ulong)pcVar5);
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool MemTable::Get(const LookupKey& key, std::string* value, Status* s) {
  Slice memkey = key.memtable_key();
  Table::Iterator iter(&table_);
  iter.Seek(memkey.data());
  if (iter.Valid()) {
    // entry format is:
    //    klength  varint32
    //    userkey  char[klength]
    //    tag      uint64
    //    vlength  varint32
    //    value    char[vlength]
    // Check that it belongs to same user key.  We do not check the
    // sequence number since the Seek() call above should have skipped
    // all entries with overly large sequence numbers.
    const char* entry = iter.key();
    uint32_t key_length;
    const char* key_ptr = GetVarint32Ptr(entry, entry + 5, &key_length);
    if (comparator_.comparator.user_comparator()->Compare(
            Slice(key_ptr, key_length - 8), key.user_key()) == 0) {
      // Correct user key
      const uint64_t tag = DecodeFixed64(key_ptr + key_length - 8);
      switch (static_cast<ValueType>(tag & 0xff)) {
        case kTypeValue: {
          if(value != nullptr) {
            Slice v = GetLengthPrefixedSlice(key_ptr + key_length);
            value->assign(v.data(), v.size());            
          }
          return true;
        }
        case kTypeDeletion:
          *s = Status::NotFound(Slice());
          return true;
      }
    }
  }
  return false;
}